

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall cmState::cmState(cmState *this,Mode mode,ProjectKind projectKind)

{
  _Base_ptr p_Var1;
  unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_> *this_00;
  _Head_base<0UL,_cmGlobVerificationManager_*,_false> __ptr;
  pointer __p;
  pointer __p_00;
  _Head_base<0UL,_cmGlobVerificationManager_*,_false> _Var2;
  _Rb_tree_header *p_Var3;
  __uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_> local_38;
  
  p_Var3 = &(this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header;
  (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->EnabledLanguages).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EnabledLanguages).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EnabledLanguages).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BuiltinCommands)._M_h._M_buckets = &(this->BuiltinCommands)._M_h._M_single_bucket;
  (this->BuiltinCommands)._M_h._M_bucket_count = 1;
  (this->BuiltinCommands)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->BuiltinCommands)._M_h._M_element_count = 0;
  (this->BuiltinCommands)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->BuiltinCommands)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->BuiltinCommands)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ScriptedCommands)._M_h._M_buckets = &(this->ScriptedCommands)._M_h._M_single_bucket;
  (this->ScriptedCommands)._M_h._M_bucket_count = 1;
  (this->ScriptedCommands)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ScriptedCommands)._M_h._M_element_count = 0;
  (this->ScriptedCommands)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ScriptedCommands)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ScriptedCommands)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->FlowControlCommands)._M_h._M_buckets = &(this->FlowControlCommands)._M_h._M_single_bucket;
  (this->FlowControlCommands)._M_h._M_bucket_count = 1;
  (this->FlowControlCommands)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->FlowControlCommands)._M_h._M_element_count = 0;
  (this->FlowControlCommands)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->FlowControlCommands)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->FlowControlCommands)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->GlobalProperties).Map_._M_h._M_buckets =
       &(this->GlobalProperties).Map_._M_h._M_single_bucket;
  (this->GlobalProperties).Map_._M_h._M_bucket_count = 1;
  (this->GlobalProperties).Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->GlobalProperties).Map_._M_h._M_element_count = 0;
  (this->GlobalProperties).Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this_00 = &this->GlobVerificationManager;
  memset(&(this->GlobalProperties).Map_._M_h._M_rehash_policy._M_next_resize,0,0x110);
  (this->SourceDirectory)._M_dataplus._M_p = (pointer)&(this->SourceDirectory).field_2;
  (this->SourceDirectory)._M_string_length = 0;
  (this->SourceDirectory).field_2._M_local_buf[0] = '\0';
  (this->BinaryDirectory)._M_dataplus._M_p = (pointer)&(this->BinaryDirectory).field_2;
  (this->BinaryDirectory)._M_string_length = 0;
  (this->BinaryDirectory).field_2._M_local_buf[0] = '\0';
  this->IsGeneratorMultiConfig = false;
  this->WindowsShell = false;
  this->WindowsVSIDE = false;
  this->GhsMultiIDE = false;
  this->WatcomWMake = false;
  this->MinGWMake = false;
  this->NMake = false;
  this->MSYSShell = false;
  this->NinjaMulti = false;
  this->StateMode = mode;
  this->StateProjectKind = projectKind;
  (this->DependencyProvider).super__Optional_base<cmDependencyProvider,_false,_false>._M_payload.
  super__Optional_payload<cmDependencyProvider,_true,_false,_false>.
  super__Optional_payload_base<cmDependencyProvider>._M_engaged = false;
  this->ProcessingTopLevelIncludes = false;
  __p_00 = (pointer)operator_new(0x40);
  p_Var3 = &(__p_00->Cache)._M_t._M_impl.super__Rb_tree_header;
  (__p_00->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p_00->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__p_00->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__p_00->Cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __p_00->CacheLoaded = false;
  *(undefined3 *)&__p_00->field_0x31 = 0;
  __p_00->CacheMajorVersion = 0;
  *(undefined8 *)&__p_00->CacheMinorVersion = 0;
  *(undefined8 *)&(__p_00->Cache)._M_t._M_impl = 0;
  *(undefined8 *)&(__p_00->Cache)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__p_00->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (__p_00->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  __p_00->CacheMinorVersion = 0;
  local_38._M_t.super__Tuple_impl<0UL,_cmCacheManager_*,_std::default_delete<cmCacheManager>_>.
  super__Head_base<0UL,_cmCacheManager_*,_false>._M_head_impl =
       (tuple<cmCacheManager_*,_std::default_delete<cmCacheManager>_>)
       (_Tuple_impl<0UL,_cmCacheManager_*,_std::default_delete<cmCacheManager>_>)0x0;
  std::__uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_>::reset
            ((__uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_> *)
             &this->CacheManager,__p_00);
  std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::~unique_ptr
            ((unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_> *)&local_38);
  _Var2._M_head_impl = (cmGlobVerificationManager *)operator_new(0x70);
  p_Var1 = (_Base_ptr)((long)&(_Var2._M_head_impl)->Cache + 8);
  *(_Base_ptr *)((long)&(_Var2._M_head_impl)->Cache + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(_Var2._M_head_impl)->Cache + 0x18) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(_Var2._M_head_impl)->Cache + 0x20) = (_Base_ptr)0x0;
  *(size_t *)((long)&(_Var2._M_head_impl)->Cache + 0x28) = 0;
  ((_Var2._M_head_impl)->VerifyScript)._M_dataplus = (pointer)0x0;
  *(size_type *)((long)&(_Var2._M_head_impl)->VerifyScript + 8) = 0;
  ((_Var2._M_head_impl)->VerifyStamp)._M_dataplus = (pointer)0x0;
  *(size_type *)((long)&(_Var2._M_head_impl)->VerifyStamp + 8) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)&(_Var2._M_head_impl)->VerifyStamp + 0x10))->_M_allocated_capacity = 0;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->VerifyStamp + 0x18) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)&(_Var2._M_head_impl)->VerifyScript + 0x10))->_M_allocated_capacity = 0;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->VerifyScript + 0x18) = 0;
  *(undefined8 *)&(_Var2._M_head_impl)->Cache = 0;
  *(undefined8 *)&((_Rb_tree_header *)((long)&(_Var2._M_head_impl)->Cache + 8))->_M_header = 0;
  *(_Base_ptr *)((long)&(_Var2._M_head_impl)->Cache + 0x18) = p_Var1;
  *(_Base_ptr *)((long)&(_Var2._M_head_impl)->Cache + 0x20) = p_Var1;
  ((_Var2._M_head_impl)->VerifyScript)._M_dataplus =
       (pointer)((long)&(_Var2._M_head_impl)->VerifyScript + 0x10);
  ((_Var2._M_head_impl)->VerifyStamp)._M_dataplus =
       (pointer)((long)&(_Var2._M_head_impl)->VerifyStamp + 0x10);
  __ptr._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmGlobVerificationManager_*,_std::default_delete<cmGlobVerificationManager>_>
       .super__Head_base<0UL,_cmGlobVerificationManager_*,_false>._M_head_impl;
  (this_00->_M_t).
  super___uniq_ptr_impl<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmGlobVerificationManager_*,_std::default_delete<cmGlobVerificationManager>_>
  .super__Head_base<0UL,_cmGlobVerificationManager_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (__ptr._M_head_impl != (cmGlobVerificationManager *)0x0) {
    std::default_delete<cmGlobVerificationManager>::operator()
              ((default_delete<cmGlobVerificationManager> *)this_00,__ptr._M_head_impl);
  }
  return;
}

Assistant:

cmState::cmState(Mode mode, ProjectKind projectKind)
  : StateMode(mode)
  , StateProjectKind(projectKind)
{
  this->CacheManager = cm::make_unique<cmCacheManager>();
  this->GlobVerificationManager = cm::make_unique<cmGlobVerificationManager>();
}